

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall google::protobuf::io::CodedInputStream::PopLimit(CodedInputStream *this,Limit limit)

{
  this->current_limit_ = limit;
  RecomputeBufferLimits(this);
  this->legitimate_message_end_ = false;
  return;
}

Assistant:

void CodedInputStream::PopLimit(Limit limit) {
  // The limit passed in is actually the *old* limit, which we returned from
  // PushLimit().
  current_limit_ = limit;
  RecomputeBufferLimits();

  // We may no longer be at a legitimate message end.  ReadTag() needs to be
  // called again to find out.
  legitimate_message_end_ = false;
}